

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array.c
# Opt level: O1

void test_array_expand(void)

{
  int iVar1;
  int elm;
  cf_array_t arr;
  undefined4 local_3c;
  cf_array_t local_38;
  
  local_3c = 0x4d2;
  iVar1 = 5;
  cf_array_init(&local_38,4,5);
  do {
    cf_array_insert(&local_38,-1,&local_3c,4);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  if (local_38.elm_count != 5) {
    __assert_fail("((&arr)->elm_count) == 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/tests/test_array.c"
                  ,0x15,"void test_array_expand()");
  }
  if (local_38.capacity != 5) {
    __assert_fail("arr.capacity == 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/tests/test_array.c"
                  ,0x16,"void test_array_expand()");
  }
  cf_array_insert(&local_38,-1,&local_3c,4);
  if (local_38.capacity == 10) {
    cf_array_deinit(&local_38);
    return;
  }
  __assert_fail("arr.capacity == 10",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/tests/test_array.c"
                ,0x18,"void test_array_expand()");
}

Assistant:

void test_array_expand() {
    cf_array_t arr;
    int i;
    int elm = 1234;
    cf_array_init(&arr, sizeof(int), 5);

    for (i = 0; i < 5; i++) {
        cf_array_insert(&arr, CF_ARRAY_END_INDEX, &elm, sizeof(int));
    }
    cf_assert(cf_array_size(&arr) == 5);
    cf_assert(arr.capacity == 5);
    cf_array_insert(&arr, CF_ARRAY_END_INDEX, &elm, sizeof(int));
    cf_assert(arr.capacity == 10);

    cf_array_deinit(&arr);
}